

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unixRead(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  __off_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  sxu32 nSize;
  int iVar4;
  uint uVar5;
  
  iVar4 = 0;
  _Var1 = lseek(*(int *)&id[2].pMethods,offset,0);
  if (_Var1 == offset) {
    sVar2 = read(*(int *)&id[2].pMethods,pBuf,(long)(int)amt);
    uVar5 = (uint)sVar2;
    if (-1 < (int)uVar5) goto LAB_0010f216;
LAB_0010f20b:
    piVar3 = __errno_location();
    iVar4 = *piVar3;
  }
  else {
    uVar5 = 0xffffffff;
    if (_Var1 == -1) goto LAB_0010f20b;
  }
  *(int *)((long)&id[3].pMethods + 4) = iVar4;
LAB_0010f216:
  iVar4 = 0;
  nSize = (int)amt - uVar5;
  if ((nSize != 0) && (iVar4 = -2, -1 < (int)uVar5)) {
    *(undefined4 *)((long)&id[3].pMethods + 4) = 0;
    SyZero((void *)((long)pBuf + (ulong)uVar5),nSize);
  }
  return iVar4;
}

Assistant:

static int unixRead(
  unqlite_file *id, 
  void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  
  got = seekAndRead(pFile, offset, pBuf, (int)amt);
  if( got==(int)amt ){
    return UNQLITE_OK;
  }else if( got<0 ){
    /* lastErrno set by seekAndRead */
    return UNQLITE_IOERR;
  }else{
    pFile->lastErrno = 0; /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    SyZero(&((char*)pBuf)[got],(sxu32)amt-got);
    return UNQLITE_IOERR;
  }
}